

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.h
# Opt level: O3

void __thiscall
dg::vr::VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::visit
          (DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *this,VRLocation *loc)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  VRLocation *local_28;
  
  p_Var1 = &(this->super_SimpleVisit).visited._M_t._M_impl.super__Rb_tree_header;
  do {
    p_Var2 = (this->super_SimpleVisit).visited._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent;
    p_Var3 = &p_Var1->_M_header;
    if (p_Var2 != (_Base_ptr)0x0) {
      do {
        if (*(VRLocation **)(p_Var2 + 1) >= loc) {
          p_Var3 = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[*(VRLocation **)(p_Var2 + 1) < loc];
      } while (p_Var2 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
         ((VRLocation *)((_Rb_tree_header *)p_Var3)->_M_node_count <= loc)) {
        return;
      }
    }
    local_28 = loc;
    std::
    _Rb_tree<dg::vr::VRLocation*,dg::vr::VRLocation*,std::_Identity<dg::vr::VRLocation*>,std::less<dg::vr::VRLocation*>,std::allocator<dg::vr::VRLocation*>>
    ::_M_emplace_unique<dg::vr::VRLocation*&>
              ((_Rb_tree<dg::vr::VRLocation*,dg::vr::VRLocation*,std::_Identity<dg::vr::VRLocation*>,std::less<dg::vr::VRLocation*>,std::allocator<dg::vr::VRLocation*>>
                *)this,&local_28);
  } while( true );
}

Assistant:

void visit(VRLocation *loc) {
            while (!Visit::wasVisited(loc))
                Visit::find(loc);
        }